

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O1

int line_search(void *vkey,void *ventry)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*ventry <= *vkey) {
    uVar1 = (uint)(*(ulong *)((long)ventry + 0x18) <= *vkey);
  }
  return uVar1;
}

Assistant:

static int
line_search (const void *vkey, const void *ventry)
{
  const uintptr_t *key = (const uintptr_t *) vkey;
  const struct line *entry = (const struct line *) ventry;
  uintptr_t pc;

  pc = *key;
  if (pc < entry->pc)
    return -1;
  else if (pc >= (entry + 1)->pc)
    return 1;
  else
    return 0;
}